

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::RemovePath
          (FieldMaskTree *this,string_view path,Descriptor *descriptor)

{
  btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
  *this_00;
  int iVar1;
  Node *this_01;
  Descriptor *pDVar2;
  bool bVar3;
  CppType CVar4;
  int iVar5;
  size_type sVar6;
  ulong uVar7;
  reference ppNVar8;
  reference pvVar9;
  long lVar10;
  FieldDescriptor *this_02;
  mapped_type *this_03;
  pointer ppVar11;
  char in_R8B;
  string_view sVar12;
  iterator iVar13;
  ConvertibleToStringView text;
  int local_14c;
  int i_1;
  iterator local_138;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_128;
  int local_120;
  undefined1 local_118 [8];
  iterator it;
  unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
  local_f8;
  int local_ec;
  size_t sStack_e8;
  int j;
  char *pcStack_e0;
  FieldDescriptor *local_d8;
  FieldDescriptor *field_descriptor;
  Descriptor *pDStack_c8;
  int i;
  Node *new_branch_node;
  Descriptor *current_descriptor;
  Node *node;
  allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*> local_99;
  undefined1 local_98 [8];
  vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
  nodes;
  ConvertibleToStringView local_68;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  undefined1 local_40 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  Descriptor *descriptor_local;
  FieldMaskTree *this_local;
  string_view path_local;
  
  parts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptor;
  bVar3 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
          ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                   *)this);
  if (!bVar3) {
    absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
              (&local_68,path);
    text.value_._M_str = (char *)0x2e;
    text.value_._M_len = (size_t)local_68.value_._M_str;
    absl::lts_20250127::StrSplit<char>(&local_58,(lts_20250127 *)local_68.value_._M_len,text,in_R8B)
    ;
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
              ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_40,&local_58);
    bVar3 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_40);
    if (bVar3) {
      nodes.
      super__Vector_base<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      sVar6 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_40);
      std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>::
      allocator(&local_99);
      std::
      vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
      ::vector((vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                *)local_98,sVar6,&local_99);
      std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>::
      ~allocator(&local_99);
      new_branch_node =
           (Node *)parts.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pDStack_c8 = (Descriptor *)0x0;
      current_descriptor = (Descriptor *)this;
      for (field_descriptor._4_4_ = 0; uVar7 = (ulong)field_descriptor._4_4_,
          sVar6 = std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)local_40), pDVar2 = current_descriptor, uVar7 < sVar6;
          field_descriptor._4_4_ = field_descriptor._4_4_ + 1) {
        ppNVar8 = std::
                  vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                  ::operator[]((vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                                *)local_98,(long)field_descriptor._4_4_);
        this_01 = new_branch_node;
        *ppNVar8 = (value_type)pDVar2;
        pvVar9 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_40,(long)field_descriptor._4_4_);
        sStack_e8 = pvVar9->_M_len;
        pcStack_e0 = pvVar9->_M_str;
        sVar12._M_len = pvVar9->_M_len;
        sVar12._M_str = pvVar9->_M_str;
        local_d8 = Descriptor::FindFieldByName((Descriptor *)this_01,sVar12);
        if ((local_d8 == (FieldDescriptor *)0x0) ||
           ((CVar4 = FieldDescriptor::cpp_type(local_d8), CVar4 != CPPTYPE_MESSAGE &&
            (lVar10 = (long)field_descriptor._4_4_,
            sVar6 = std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)local_40), lVar10 != sVar6 - 1)))) {
          if (pDStack_c8 != (Descriptor *)0x0) {
            Node::ClearChildren((Node *)pDStack_c8);
          }
          nodes.
          super__Vector_base<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          goto LAB_01b55865;
        }
        bVar3 = absl::lts_20250127::container_internal::
                btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                         *)current_descriptor);
        if (bVar3) {
          if (pDStack_c8 == (Descriptor *)0x0) {
            pDStack_c8 = current_descriptor;
          }
          for (local_ec = 0; iVar1 = local_ec,
              iVar5 = Descriptor::field_count((Descriptor *)new_branch_node), iVar1 < iVar5;
              local_ec = local_ec + 1) {
            std::make_unique<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>();
            pDVar2 = current_descriptor;
            this_02 = Descriptor::field((Descriptor *)new_branch_node,local_ec);
            sVar12 = FieldDescriptor::name(this_02);
            it._8_8_ = sVar12._M_len;
            this_03 = absl::lts_20250127::container_internal::
                      btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
                      ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
                                  *)pDVar2,(key_arg<std::basic_string_view<char>_> *)&it.position_);
            std::
            unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
            ::operator=(this_03,&local_f8);
            std::
            unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
            ::~unique_ptr(&local_f8);
          }
        }
        pDVar2 = current_descriptor;
        pvVar9 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_40,(long)field_descriptor._4_4_);
        iVar13 = absl::lts_20250127::container_internal::
                 btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
                 ::find<std::basic_string_view<char,std::char_traits<char>>>
                           ((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
                             *)pDVar2,pvVar9);
        local_128 = iVar13.node_;
        local_120 = iVar13.position_;
        local_118 = (undefined1  [8])local_128;
        it.node_._0_4_ = local_120;
        iVar13 = absl::lts_20250127::container_internal::
                 btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                 ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                        *)current_descriptor);
        local_138.node_ = iVar13.node_;
        local_138.position_ = iVar13.position_;
        bVar3 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                ::operator==((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                              *)local_118,&local_138);
        if (bVar3) {
          nodes.
          super__Vector_base<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          goto LAB_01b55865;
        }
        ppVar11 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                  ::operator->((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                                *)local_118);
        current_descriptor =
             (Descriptor *)
             std::
             unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
             ::get(&ppVar11->second);
        CVar4 = FieldDescriptor::cpp_type(local_d8);
        if (CVar4 == CPPTYPE_MESSAGE) {
          new_branch_node = (Node *)FieldDescriptor::message_type(local_d8);
        }
      }
      sVar6 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_40);
      local_14c = (int)sVar6;
      do {
        local_14c = local_14c + -1;
        if (local_14c < 0) break;
        ppNVar8 = std::
                  vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                  ::operator[]((vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                                *)local_98,(long)local_14c);
        this_00 = (btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
                   *)*ppNVar8;
        pvVar9 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_40,(long)local_14c);
        absl::lts_20250127::container_internal::
        btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>>
        ::erase<std::basic_string_view<char,std::char_traits<char>>>(this_00,pvVar9);
        ppNVar8 = std::
                  vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                  ::operator[]((vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                                *)local_98,(long)local_14c);
        bVar3 = absl::lts_20250127::container_internal::
                btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                         *)*ppNVar8);
      } while (bVar3);
      nodes.
      super__Vector_base<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_01b55865:
      std::
      vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
      ::~vector((vector<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::allocator<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>
                 *)local_98);
    }
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_40);
  }
  return;
}

Assistant:

void FieldMaskTree::RemovePath(absl::string_view path,
                               const Descriptor* descriptor) {
  if (root_.children.empty()) {
    // Nothing to be removed from an empty tree. We shortcut it here so an empty
    // tree won't be interpreted as a field mask containing all fields by the
    // code below.
    return;
  }
  std::vector<absl::string_view> parts = absl::StrSplit(path, '.');
  if (parts.empty()) {
    return;
  }
  std::vector<Node*> nodes(parts.size());
  Node* node = &root_;
  const Descriptor* current_descriptor = descriptor;
  Node* new_branch_node = nullptr;
  for (int i = 0; i < parts.size(); ++i) {
    nodes[i] = node;
    const FieldDescriptor* field_descriptor =
        current_descriptor->FindFieldByName(parts[i]);
    if (field_descriptor == nullptr ||
        (field_descriptor->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE &&
         i != parts.size() - 1)) {
      // Invalid path.
      if (new_branch_node != nullptr) {
        // If add any new nodes, cleanup.
        new_branch_node->ClearChildren();
      }
      return;
    }

    if (node->children.empty()) {
      if (new_branch_node == nullptr) {
        new_branch_node = node;
      }
      for (int j = 0; j < current_descriptor->field_count(); ++j) {
        node->children[current_descriptor->field(j)->name()] =
            absl::make_unique<Node>();
      }
    }
    auto it = node->children.find(parts[i]);
    if (it == node->children.end()) return;
    node = it->second.get();
    if (field_descriptor->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      current_descriptor = field_descriptor->message_type();
    }
  }
  // Remove path.
  for (int i = parts.size() - 1; i >= 0; i--) {
    nodes[i]->children.erase(parts[i]);
    if (!nodes[i]->children.empty()) {
      break;
    }
  }
}